

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# asio_service.cxx
# Opt level: O1

void __thiscall
nuraft::asio_rpc_client::connected
          (asio_rpc_client *this,ptr<req_msg> *req,rpc_handler *when_done,uint64_t send_timeout_ms,
          error_code err,iterator itor)

{
  key *pkVar1;
  uint uVar2;
  pointer pcVar3;
  pointer pcVar4;
  element_type *peVar5;
  int iVar6;
  undefined8 uVar7;
  uint uVar8;
  undefined1 local_101;
  uint64_t send_timeout_ms_local;
  ptr<rpc_exception> except;
  ptr<resp_msg> rsp;
  ssl_socket *local_c8 [2];
  undefined1 local_b8 [24];
  undefined1 local_a0 [16];
  service_type local_90;
  
  uVar8 = err._M_value;
  send_timeout_ms_local = send_timeout_ms;
  if (uVar8 == 0) {
    peVar5 = (this->l_).super___shared_ptr<nuraft::logger,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
    if (peVar5 != (element_type *)0x0) {
      iVar6 = (**(code **)(*(long *)peVar5 + 0x38))();
      if (3 < iVar6) {
        peVar5 = (this->l_).super___shared_ptr<nuraft::logger,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
        msg_if_given_abi_cxx11_
                  ((string *)local_a0,"%p connected to %s:%s (as a client)",this,
                   (this->host_)._M_dataplus._M_p,(this->port_)._M_dataplus._M_p);
        (**(code **)(*(long *)peVar5 + 0x40))
                  (peVar5,4,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/greensky00[P]NuRaft/src/asio_service.cxx"
                   ,"connected",0x528,(string *)local_a0);
        if ((service_type *)local_a0._0_8_ != (service_type *)(local_a0 + 0x10)) {
          operator_delete((void *)local_a0._0_8_);
        }
      }
    }
    if (this->ssl_enabled_ == true) {
      local_a0._0_8_ = handle_handshake;
      local_a0._8_8_ = 0;
      std::
      _Tuple_impl<1ul,std::shared_ptr<nuraft::req_msg>,std::function<void(std::shared_ptr<nuraft::resp_msg>&,std::shared_ptr<nuraft::rpc_exception>&)>,unsigned_long,std::_Placeholder<1>>
      ::
      _Tuple_impl<std::shared_ptr<nuraft::req_msg>&,std::function<void(std::shared_ptr<nuraft::resp_msg>&,std::shared_ptr<nuraft::rpc_exception>&)>&,unsigned_long&,std::_Placeholder<1>const&,void>
                ((_Tuple_impl<1ul,std::shared_ptr<nuraft::req_msg>,std::function<void(std::shared_ptr<nuraft::resp_msg>&,std::shared_ptr<nuraft::rpc_exception>&)>,unsigned_long,std::_Placeholder<1>>
                  *)(local_a0 + 0x10),req,when_done,&send_timeout_ms_local,
                 (_Placeholder<1> *)&std::placeholders::_1);
      local_c8[0] = &this->ssl_socket_;
      local_90.timer_queue_.timers_ = (per_timer_data *)this;
      asio::ssl::stream<asio::basic_stream_socket<asio::ip::tcp,asio::any_io_executor>&>::
      initiate_async_handshake::operator()
                (local_c8,(_Bind<void_(nuraft::asio_rpc_client::*(nuraft::asio_rpc_client_*,_std::shared_ptr<nuraft::req_msg>,_std::function<void_(std::shared_ptr<nuraft::resp_msg>_&,_std::shared_ptr<nuraft::rpc_exception>_&)>,_unsigned_long,_std::_Placeholder<1>))(std::shared_ptr<nuraft::req_msg>_&,_std::function<void_(std::shared_ptr<nuraft::resp_msg>_&,_std::shared_ptr<nuraft::rpc_exception>_&)>_&,_unsigned_long,_const_std::error_code_&)>
                           *)local_a0,client);
      if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
          local_90.timer_queue_.super_timer_queue_base.next_ !=
          (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                  ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
                   local_90.timer_queue_.super_timer_queue_base.next_);
      }
      if (local_90.
          super_execution_context_service_base<asio::detail::deadline_timer_service<asio::detail::chrono_time_traits<std::chrono::_V2::steady_clock,_asio::wait_traits<std::chrono::_V2::steady_clock>_>_>_>
          .super_service.owner_ != (execution_context *)0x0) {
        pkVar1 = &local_90.
                  super_execution_context_service_base<asio::detail::deadline_timer_service<asio::detail::chrono_time_traits<std::chrono::_V2::steady_clock,_asio::wait_traits<std::chrono::_V2::steady_clock>_>_>_>
                  .super_service.key_;
        (*(code *)local_90.
                  super_execution_context_service_base<asio::detail::deadline_timer_service<asio::detail::chrono_time_traits<std::chrono::_V2::steady_clock,_asio::wait_traits<std::chrono::_V2::steady_clock>_>_>_>
                  .super_service.owner_)((_Any_data *)pkVar1,(_Any_data *)pkVar1,__destroy_functor);
      }
    }
    else {
      (*(this->super_rpc_client)._vptr_rpc_client[2])(this,req,when_done,send_timeout_ms_local);
    }
  }
  else {
    LOCK();
    (this->abandoned_)._M_base._M_i = true;
    UNLOCK();
    rsp.super___shared_ptr<nuraft::resp_msg,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
         (element_type *)0x0;
    rsp.super___shared_ptr<nuraft::resp_msg,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
         (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
    local_90.scheduler_ = (timer_scheduler *)0x460075;
    uVar2 = (((req->super___shared_ptr<nuraft::req_msg,_(__gnu_cxx::_Lock_policy)2>)._M_ptr)->
            super_msg_base).dst_;
    pcVar3 = (this->host_)._M_dataplus._M_p;
    pcVar4 = (this->port_)._M_dataplus._M_p;
    (**(code **)(*(long *)err._M_cat + 0x20))(local_c8,err._M_cat,uVar8);
    snprintf((char *)local_a0,100,(char *)local_90.scheduler_,(ulong)uVar2,pcVar3,pcVar4,
             (ulong)uVar8,local_c8[0]);
    except.super___shared_ptr<nuraft::rpc_exception,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
         (element_type *)0x0;
    local_b8._16_8_ = (BIO *)local_a0;
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::
    __shared_count<nuraft::rpc_exception,std::allocator<nuraft::rpc_exception>,char_const*,std::shared_ptr<nuraft::req_msg>&>
              (&except.super___shared_ptr<nuraft::rpc_exception,_(__gnu_cxx::_Lock_policy)2>.
                _M_refcount,(rpc_exception **)&except,(allocator<nuraft::rpc_exception> *)&local_101
               ,(char **)(local_b8 + 0x10),req);
    if (local_c8[0] != (ssl_socket *)local_b8) {
      operator_delete(local_c8[0]);
    }
    if ((when_done->super__Function_base)._M_manager == (_Manager_type)0x0) {
      uVar7 = std::__throw_bad_function_call();
      __clang_call_terminate(uVar7);
    }
    (*when_done->_M_invoker)((_Any_data *)when_done,&rsp,&except);
    if (except.super___shared_ptr<nuraft::rpc_exception,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
        _M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                (except.super___shared_ptr<nuraft::rpc_exception,_(__gnu_cxx::_Lock_policy)2>.
                 _M_refcount._M_pi);
    }
    if (rsp.super___shared_ptr<nuraft::resp_msg,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi !=
        (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                (rsp.super___shared_ptr<nuraft::resp_msg,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
                 _M_pi);
    }
  }
  return;
}

Assistant:

void connected(ptr<req_msg>& req,
                   rpc_handler& when_done,
                   uint64_t send_timeout_ms,
                   std::error_code err,
                   asio::ip::tcp::resolver::iterator itor)
    {
        if (!err) {
            p_in( "%p connected to %s:%s (as a client)",
                  this, host_.c_str(), port_.c_str() );
            if (ssl_enabled_) {
#ifdef SSL_LIBRARY_NOT_FOUND
                assert(0); // Should not reach here.
#else
                ssl_socket_.async_handshake
                    ( asio::ssl::stream_base::client,
                      std::bind( &asio_rpc_client::handle_handshake,
                                 this,
                                 req,
                                 when_done,
                                 send_timeout_ms,
                                 std::placeholders::_1 ) );
#endif
            } else {
                this->send(req, when_done, send_timeout_ms);
            }

        } else {
            abandoned_ = true;
            ptr<resp_msg> rsp;
            ptr<rpc_exception> except
                ( cs_new<rpc_exception>
                  ( sstrfmt("failed to connect to peer %d, %s:%s, error %d, %s")
                           .fmt( req->get_dst(), host_.c_str(),
                                 port_.c_str(), err.value(), err.message().c_str() ),
                    req ) );
            when_done(rsp, except);
        }
    }